

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::ReadRaw(CodedInputStream *this,void *buffer,int size)

{
  bool bVar1;
  int amount;
  int local_24;
  int current_buffer_size;
  int size_local;
  void *buffer_local;
  CodedInputStream *this_local;
  
  local_24 = size;
  _current_buffer_size = buffer;
  do {
    amount = BufferSize(this);
    if (local_24 <= amount) {
      memcpy(_current_buffer_size,this->buffer_,(long)local_24);
      Advance(this,local_24);
      return true;
    }
    memcpy(_current_buffer_size,this->buffer_,(long)amount);
    _current_buffer_size = (void *)((long)_current_buffer_size + (long)amount);
    local_24 = local_24 - amount;
    Advance(this,amount);
    bVar1 = Refresh(this);
  } while (bVar1);
  return false;
}

Assistant:

bool CodedInputStream::ReadRaw(void* buffer, int size) {
  int current_buffer_size;
  while ((current_buffer_size = BufferSize()) < size) {
    // Reading past end of buffer.  Copy what we have, then refresh.
    memcpy(buffer, buffer_, current_buffer_size);
    buffer = reinterpret_cast<uint8*>(buffer) + current_buffer_size;
    size -= current_buffer_size;
    Advance(current_buffer_size);
    if (!Refresh()) return false;
  }

  memcpy(buffer, buffer_, size);
  Advance(size);

  return true;
}